

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O0

LY_ERR yin_parse_orderedby(lysp_yin_ctx *ctx,void *parent,uint16_t *flags,lysp_ext_instance **exts)

{
  int iVar1;
  ly_ctx *local_70;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  yin_subelement subelems [1];
  char *local_38;
  char *temp_val;
  lysp_ext_instance **exts_local;
  uint16_t *flags_local;
  void *parent_local;
  lysp_yin_ctx *ctx_local;
  
  ret___1 = LY_STMT_EXTENSION_INSTANCE;
  ret__ = 0;
  subelems[0].type = LY_STMT_NONE;
  subelems[0]._4_4_ = 0;
  subelems[0].dest = (void *)0x0;
  temp_val = (char *)exts;
  exts_local = (lysp_ext_instance **)flags;
  flags_local = (uint16_t *)parent;
  parent_local = ctx;
  ctx_local._4_4_ = lyxml_ctx_next(ctx->xmlctx);
  if ((ctx_local._4_4_ == LY_SUCCESS) &&
     (ctx_local._4_4_ =
           yin_parse_attribute((lysp_yin_ctx *)parent_local,YIN_ARG_VALUE,&local_38,Y_STR_ARG,
                               LY_STMT_ORDERED_BY), ctx_local._4_4_ == LY_SUCCESS)) {
    iVar1 = strcmp(local_38,"system");
    if (iVar1 == 0) {
      *(ushort *)exts_local = *(ushort *)exts_local | 0x80;
    }
    else {
      iVar1 = strcmp(local_38,"user");
      if (iVar1 != 0) {
        if (parent_local == (void *)0x0) {
          local_70 = (ly_ctx *)0x0;
        }
        else {
          local_70 = *(ly_ctx **)
                      **(undefined8 **)
                        (*(long *)(*(long *)((long)parent_local + 0x38) + 8) +
                        (ulong)(*(int *)(*(long *)((long)parent_local + 0x38) + 4) - 1) * 8);
        }
        ly_vlog(local_70,(char *)0x0,LYVE_SYNTAX_YIN,
                "Invalid value \"%s\" of \"%s\" attribute in \"%s\" element. Valid values are \"%s\" and \"%s\"."
                ,local_38,"value","ordered-by","system","user");
        lydict_remove((ly_ctx *)**(undefined8 **)((long)parent_local + 0x48),local_38);
        return LY_EVALID;
      }
      *(ushort *)exts_local = *(ushort *)exts_local | 0x40;
    }
    lydict_remove((ly_ctx *)**(undefined8 **)((long)parent_local + 0x48),local_38);
    ctx_local._4_4_ =
         yin_parse_content((lysp_yin_ctx *)parent_local,(yin_subelement *)&ret___1,1,flags_local,
                           LY_STMT_ORDERED_BY,(char **)0x0,(lysp_ext_instance **)temp_val);
    if (ctx_local._4_4_ == LY_SUCCESS) {
      ctx_local._4_4_ = LY_SUCCESS;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
yin_parse_orderedby(struct lysp_yin_ctx *ctx, const void *parent, uint16_t *flags, struct lysp_ext_instance **exts)
{
    const char *temp_val;
    struct yin_subelement subelems[] = {
        {LY_STMT_EXTENSION_INSTANCE, NULL, 0},
    };

    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_VALUE, &temp_val, Y_STR_ARG, LY_STMT_ORDERED_BY));
    if (strcmp(temp_val, "system") == 0) {
        *flags |= LYS_ORDBY_SYSTEM;
    } else if (strcmp(temp_val, "user") == 0) {
        *flags |= LYS_ORDBY_USER;
    } else {
        LOGVAL_PARSER((struct lysp_ctx *)ctx, LY_VCODE_INVAL_YIN VALID_VALS2, temp_val, "value",
                "ordered-by", "system", "user");
        lydict_remove(ctx->xmlctx->ctx, temp_val);
        return LY_EVALID;
    }
    lydict_remove(ctx->xmlctx->ctx, temp_val);

    LY_CHECK_RET(yin_parse_content(ctx, subelems, ly_sizeofarray(subelems), parent, LY_STMT_ORDERED_BY, NULL, exts));

    return LY_SUCCESS;
}